

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O3

bool __thiscall USBControlTransferParser::ParseStringDescriptor(USBControlTransferParser *this)

{
  USBAnalyzerResults *pUVar1;
  char16_t *__first;
  int iVar2;
  mapped_type *pmVar3;
  int iVar4;
  int iVar5;
  key_type local_aa;
  string utf8_string_descriptor;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  
  if ((char)(this->mRequest).wValue == '\0') {
    iVar4 = this->mDescBytes;
    iVar2 = this->mParsedOffset;
    if ((iVar2 < iVar4) && (iVar5 = this->mPacketOffset, iVar5 < this->mPacketDataBytes)) {
      do {
        pUVar1 = this->pResults;
        USBPacket::GetDataPayloadField
                  ((USBPacket *)&convert,(int)this->pPacket,iVar5,'\x02',
                   (char *)(ulong)this->mAddress,0x13c35d,'\x12');
        AnalyzerResults::AddFrame((Frame *)pUVar1);
        Frame::~Frame((Frame *)&convert);
        iVar5 = this->mPacketOffset + 2;
        this->mPacketOffset = iVar5;
        iVar4 = this->mDescBytes;
        iVar2 = this->mParsedOffset + 2;
        this->mParsedOffset = iVar2;
        if (iVar4 <= iVar2) break;
      } while (iVar5 < this->mPacketDataBytes);
    }
  }
  else {
    iVar2 = this->mParsedOffset;
    if (iVar2 == 2) {
      (this->utf16StringDescriptor)._M_string_length = 0;
      *(this->utf16StringDescriptor)._M_dataplus._M_p = L'\0';
    }
    iVar4 = this->mDescBytes;
    if ((iVar2 < iVar4) && (iVar5 = this->mPacketOffset, iVar5 < this->mPacketDataBytes)) {
      do {
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back(&this->utf16StringDescriptor,
                    *(char16_t *)
                     ((this->pPacket->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)iVar5 + 2));
        pUVar1 = this->pResults;
        USBPacket::GetDataPayloadField
                  ((USBPacket *)&convert,(int)this->pPacket,this->mPacketOffset,'\x02',
                   (char *)(ulong)this->mAddress,0x13c365,'\x1b');
        AnalyzerResults::AddFrame((Frame *)pUVar1);
        Frame::~Frame((Frame *)&convert);
        iVar5 = this->mPacketOffset + 2;
        this->mPacketOffset = iVar5;
        iVar4 = this->mDescBytes;
        iVar2 = this->mParsedOffset + 2;
        this->mParsedOffset = iVar2;
        if (iVar4 <= iVar2) break;
      } while (iVar5 < this->mPacketDataBytes);
    }
    if (iVar4 == iVar2) {
      convert._M_cvt._M_t.
      super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
      .
      super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
            )operator_new(0x20);
      *(undefined4 *)
       ((long)convert._M_cvt._M_t.
              super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              .
              super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
              ._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)convert._M_cvt._M_t.
              super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              .
              super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
              ._M_head_impl + 0x10) = 0x10ffff;
      *(undefined4 *)
       ((long)convert._M_cvt._M_t.
              super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
              .
              super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
              ._M_head_impl + 0x18) = 0;
      *(undefined ***)
       convert._M_cvt._M_t.
       super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
       .
       super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
       ._M_head_impl = &PTR____codecvt_utf8_utf16_base_0015a628;
      convert._M_byte_err_string._M_dataplus._M_p = (pointer)&convert._M_byte_err_string.field_2;
      convert._M_byte_err_string._M_string_length = 0;
      convert._M_byte_err_string.field_2._M_local_buf[0] = '\0';
      convert._M_wide_err_string._M_dataplus._M_p = (pointer)&convert._M_wide_err_string.field_2;
      convert._M_wide_err_string._M_string_length = 0;
      convert._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
      convert._M_state.__count = 0;
      convert._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      convert._M_count = 0;
      convert._M_with_cvtstate = false;
      convert._M_with_strings = false;
      __first = (this->utf16StringDescriptor)._M_dataplus._M_p;
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::to_bytes(&utf8_string_descriptor,&convert,__first,
                 __first + (this->utf16StringDescriptor)._M_string_length);
      local_aa.first = this->mAddress;
      local_aa.second = (uchar)(this->mRequest).wValue;
      pmVar3 = std::
               map<std::pair<unsigned_char,_unsigned_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->pResults->mAllStringDescriptors,&local_aa);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)utf8_string_descriptor._M_dataplus._M_p != &utf8_string_descriptor.field_2) {
        operator_delete(utf8_string_descriptor._M_dataplus._M_p);
      }
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
      ::~wstring_convert(&convert);
      iVar4 = this->mDescBytes;
      iVar2 = this->mParsedOffset;
    }
  }
  return iVar4 == iVar2;
}

Assistant:

bool USBControlTransferParser::ParseStringDescriptor()
{
    // if this is a supported language table desriptor or actual string descriptor
    if( mRequest.GetRequestedDescriptorIndex() == 0 )
    {
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wLANGID", Fld_wLANGID ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }
    }
    else
    {
        if( mParsedOffset == 2 )
            utf16StringDescriptor.clear();

        // the actual UNICODE string
        while( mDescBytes > mParsedOffset && mPacketDataBytes > mPacketOffset )
        {
            char16_t code_unit = static_cast<char16_t>( pPacket->GetDataPayload( mPacketOffset, 2 ) );
            utf16StringDescriptor.push_back( code_unit );

            pResults->AddFrame( pPacket->GetDataPayloadField( mPacketOffset, 2, mAddress, "wchar", Fld_Wchar ) );
            mPacketOffset += 2;
            mParsedOffset += 2;
        }

        // do we have the entire string?
        if( mDescBytes == mParsedOffset )
        {
            std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
            std::string utf8_string_descriptor = convert.to_bytes( utf16StringDescriptor );
            pResults->AddStringDescriptor( mAddress, mRequest.GetRequestedDescriptorIndex(), utf8_string_descriptor );
        }
    }
    // return true if we've finished parsing the string descriptor, according to the parsed bLength
    return mDescBytes == mParsedOffset;
}